

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operats.c
# Opt level: O0

Vector * Mul_MV(Matrix *M,Vector *V)

{
  ulong Dim;
  ulong uVar1;
  size_t *psVar2;
  ElType **ppEVar3;
  Real *pRVar4;
  Real *pRVar5;
  double dVar6;
  bool bVar7;
  LASErrIdType LVar8;
  char *pcVar9;
  size_t sVar10;
  size_t sVar11;
  char *pcVar12;
  char *pcVar13;
  Real *VResCmp;
  Real *VCmp;
  ElType *PtrEl;
  ElType **MEl;
  Boolean MultiplMVIsOne;
  size_t *MLen;
  size_t ElCount;
  size_t Len;
  size_t Clm;
  size_t Row;
  size_t ClmDim;
  size_t RowDim;
  double Cmp;
  double Sum;
  double MultiplMV;
  char *VResName;
  Vector *VRes;
  Vector *V_local;
  Matrix *M_local;
  
  M_Lock(M);
  V_Lock(V);
  LVar8 = LASResult();
  if (LVar8 == LASOK) {
    if (M->ClmDim == V->Dim) {
      Dim = M->RowDim;
      uVar1 = M->ClmDim;
      VResName = (char *)malloc(0x30);
      pcVar9 = M_GetName(M);
      sVar10 = strlen(pcVar9);
      pcVar9 = V_GetName(V);
      sVar11 = strlen(pcVar9);
      pcVar9 = (char *)malloc(sVar10 + sVar11 + 10);
      if (((Vector *)VResName == (Vector *)0x0) || (pcVar9 == (char *)0x0)) {
        pcVar12 = M_GetName(M);
        pcVar13 = V_GetName(V);
        LASError(LASMemAllocErr,"Mul_MV",pcVar12,pcVar13,(char *)0x0);
        if ((Vector *)VResName != (Vector *)0x0) {
          free(VResName);
        }
      }
      else {
        pcVar12 = M_GetName(M);
        pcVar13 = V_GetName(V);
        sprintf(pcVar9,"(%s) * (%s)",pcVar12,pcVar13);
        V_Constr((Vector *)VResName,pcVar9,Dim,Tempor,True);
        LVar8 = LASResult();
        if (LVar8 == LASOK) {
          psVar2 = M->Len;
          ppEVar3 = M->El;
          pRVar4 = V->Cmp;
          pRVar5 = ((Vector *)VResName)->Cmp;
          if (M->ElOrder == Clmws) {
            V_SetAllCmp((Vector *)VResName,0.0);
          }
          dVar6 = M->Multipl * V->Multipl;
          bVar7 = 2.220446049250313e-15 <= ABS(dVar6 - 1.0);
          if (M->ElOrder == Rowws) {
            for (Clm = 1; Clm <= Dim; Clm = Clm + 1) {
              MLen = (size_t *)psVar2[Clm];
              VCmp = (Real *)ppEVar3[Clm];
              Cmp = 0.0;
              for (; MLen != (size_t *)0x0; MLen = (size_t *)((long)MLen + -1)) {
                Cmp = VCmp[1] * pRVar4[(long)*VCmp] + Cmp;
                VCmp = VCmp + 2;
              }
              if (bVar7) {
                pRVar5[Clm] = dVar6 * Cmp;
              }
              else {
                pRVar5[Clm] = Cmp;
              }
            }
          }
          if (M->ElOrder == Clmws) {
            for (Len = 1; Len <= uVar1; Len = Len + 1) {
              MLen = (size_t *)psVar2[Len];
              VCmp = (Real *)ppEVar3[Len];
              if (bVar7) {
                RowDim = (size_t)(dVar6 * pRVar4[Len]);
              }
              else {
                RowDim = (size_t)pRVar4[Len];
              }
              for (; MLen != (size_t *)0x0; MLen = (size_t *)((long)MLen + -1)) {
                pRVar5[(long)*VCmp] = VCmp[1] * (double)RowDim + pRVar5[(long)*VCmp];
                VCmp = VCmp + 2;
              }
            }
          }
        }
      }
      if (pcVar9 != (char *)0x0) {
        free(pcVar9);
      }
    }
    else {
      pcVar9 = M_GetName(M);
      pcVar12 = V_GetName(V);
      LASError(LASDimErr,"Mul_MV",pcVar9,pcVar12,(char *)0x0);
      VResName = (char *)0x0;
    }
  }
  else {
    VResName = (char *)0x0;
  }
  M_Unlock(M);
  V_Unlock(V);
  return (Vector *)VResName;
}

Assistant:

Vector *Mul_MV(Matrix *M, Vector *V)
/* VRes = M * V */
{
    Vector *VRes;

    char *VResName;
    double MultiplMV;
    double Sum, Cmp;
    size_t RowDim, ClmDim, Row, Clm, Len, ElCount;
    size_t *MLen;
    Boolean MultiplMVIsOne;
    ElType **MEl, *PtrEl;
    Real *VCmp, *VResCmp;

    M_Lock(M);
    V_Lock(V);
    
    if (LASResult() == LASOK) {
        if (M->ClmDim == V->Dim) {
            RowDim = M->RowDim;
            ClmDim = M->ClmDim;
            VRes = (Vector *)malloc(sizeof(Vector));
            VResName = (char *)malloc((strlen(M_GetName(M)) + strlen(V_GetName(V)) + 10)
                           * sizeof(char));
            if (VRes != NULL && VResName != NULL) {
                sprintf(VResName, "(%s) * (%s)", M_GetName(M), V_GetName(V));
                V_Constr(VRes, VResName, RowDim, Tempor, True);
                if (LASResult() == LASOK) {
                    /* assignment of auxiliary lokal variables */
                    MLen = M->Len;
                    MEl = M->El;
                    VCmp = V->Cmp;
                    VResCmp = VRes->Cmp;

                    /* initialisation of the vector VRes */
                    if (M->ElOrder == Clmws)
                        V_SetAllCmp(VRes, 0.0);

                    /* analysis of multipliers of the matrix M and the vector V */
                    MultiplMV = M->Multipl * V->Multipl;
                    if (IsOne(MultiplMV)) {
                        MultiplMVIsOne = True;
                    } else {
                        MultiplMVIsOne = False;
                    }

                    /* multiplication of matrix elements by vector components */
                    if (M->ElOrder == Rowws) {
                        for (Row = 1; Row <= RowDim; Row++) {
                            Len = MLen[Row];
                            PtrEl = MEl[Row];
                            Sum = 0.0;
                            for (ElCount = Len; ElCount > 0; ElCount--) {
                                Sum += (*PtrEl).Val * VCmp[(*PtrEl).Pos];
                                PtrEl++;
                            }
                            if (MultiplMVIsOne)
                                VResCmp[Row] = Sum;
                            else
                                VResCmp[Row] = MultiplMV * Sum;
                        }
                    }
                    if (M->ElOrder == Clmws) {
                        for (Clm = 1; Clm <= ClmDim; Clm++) {
                            Len = MLen[Clm];
                            PtrEl = MEl[Clm];
                            if (MultiplMVIsOne)
                                   Cmp = VCmp[Clm];
                            else
                                Cmp = MultiplMV * VCmp[Clm];
                            for (ElCount = Len; ElCount > 0; ElCount--) {
                                VResCmp[(*PtrEl).Pos] += (*PtrEl).Val * Cmp;
                                PtrEl++;
                            }
                        }
                    }
                }
            } else {
                LASError(LASMemAllocErr, "Mul_MV", M_GetName(M), V_GetName(V), NULL);
                if (VRes != NULL)
                    free(VRes);
            }
            
            if (VResName != NULL)
                free(VResName);
        } else {
            LASError(LASDimErr, "Mul_MV", M_GetName(M), V_GetName(V), NULL);
            VRes = NULL;
        }
    } else {
        VRes = NULL;
    }

    M_Unlock(M);
    V_Unlock(V);
 
    return(VRes);
}